

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O1

void asmjit::v1_14::ConstPool_addGap(ConstPool *self,size_t offset,size_t size)

{
  Zone *this;
  Gap *pGVar1;
  size_t sVar2;
  ulong uVar3;
  
  while( true ) {
    if (size == 0) {
      return;
    }
    if (size < 0x20 || (offset & 0x1f) != 0) {
      if (size < 0x10 || (offset & 0xf) != 0) {
        if (size < 8 || (offset & 7) != 0) {
          if (size < 4 || (offset & 3) != 0) {
            uVar3 = (ulong)((offset & 1) == 0 && size != 1);
            sVar2 = uVar3 + 1;
          }
          else {
            sVar2 = 4;
            uVar3 = 2;
          }
        }
        else {
          sVar2 = 8;
          uVar3 = 3;
        }
      }
      else {
        sVar2 = 0x10;
        uVar3 = 4;
      }
    }
    else {
      sVar2 = 0x20;
      uVar3 = 5;
    }
    pGVar1 = self->_gapPool;
    if (pGVar1 == (Gap *)0x0) {
      this = self->_zone;
      pGVar1 = (Gap *)(*(long *)this + 7U & 0xfffffffffffffff8);
      if (pGVar1 < *(Gap **)(this + 8) && 0x17 < (ulong)((long)*(Gap **)(this + 8) - (long)pGVar1))
      {
        *(Gap **)this = pGVar1 + 1;
      }
      else {
        pGVar1 = (Gap *)Zone::_alloc(this,0x18,8);
      }
    }
    else {
      self->_gapPool = pGVar1->_next;
    }
    if (pGVar1 == (Gap *)0x0) break;
    pGVar1->_next = self->_gaps[uVar3];
    self->_gaps[uVar3] = pGVar1;
    pGVar1->_offset = offset;
    pGVar1->_size = sVar2;
    offset = offset + sVar2;
    size = size - sVar2;
  }
  return;
}

Assistant:

static void ConstPool_addGap(ConstPool* self, size_t offset, size_t size) noexcept {
  ASMJIT_ASSERT(size > 0);

  while (size > 0) {
    size_t gapIndex;
    size_t gapSize;

    if (size >= 32 && Support::isAligned<size_t>(offset, 32)) {
      gapIndex = ConstPool::kIndex32;
      gapSize = 32;
    }
    else if (size >= 16 && Support::isAligned<size_t>(offset, 16)) {
      gapIndex = ConstPool::kIndex16;
      gapSize = 16;
    }
    else if (size >= 8 && Support::isAligned<size_t>(offset, 8)) {
      gapIndex = ConstPool::kIndex8;
      gapSize = 8;
    }
    else if (size >= 4 && Support::isAligned<size_t>(offset, 4)) {
      gapIndex = ConstPool::kIndex4;
      gapSize = 4;
    }
    else if (size >= 2 && Support::isAligned<size_t>(offset, 2)) {
      gapIndex = ConstPool::kIndex2;
      gapSize = 2;
    }
    else {
      gapIndex = ConstPool::kIndex1;
      gapSize = 1;
    }

    // We don't have to check for errors here, if this failed nothing really happened (just the gap won't be
    // visible) and it will fail again at place where the same check would generate `kErrorOutOfMemory` error.
    ConstPool::Gap* gap = ConstPool_allocGap(self);
    if (!gap)
      return;

    gap->_next = self->_gaps[gapIndex];
    self->_gaps[gapIndex] = gap;

    gap->_offset = offset;
    gap->_size = gapSize;

    offset += gapSize;
    size -= gapSize;
  }
}